

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *p)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  int *piVar12;
  Bmc_EsPar_t *pBVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int (*paiVar17) [32];
  int (*plits) [64];
  bmcg_sat_solver *s;
  long lVar18;
  bool bVar19;
  int *piVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  iVar16 = p->pPars->nVars;
  uVar7 = p->nObjs;
  if (iVar16 < (int)uVar7) {
    iVar22 = 0;
    do {
      iVar4 = Zyx_ManCollectFanins(p,iVar16);
      iVar14 = p->pPars->nLutSize;
      if (iVar4 != iVar14) {
        if (iVar4 != p->nLits[1]) {
          __assert_fail("nFanins == p->nLits[1]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                        ,0x364,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
        }
        iVar22 = iVar22 + 1;
        if (iVar14 < iVar4) {
          iVar14 = iVar14 + 1;
          p->nLits[1] = iVar14;
          s = p->pSat;
          plits = p->pLits + 1;
        }
        else {
          s = p->pSat;
          iVar14 = p->nLits[0];
          plits = p->pLits;
        }
        iVar14 = bmcg_sat_solver_addclause(s,*plits,iVar14);
        if (iVar14 == 0) {
          return -1;
        }
      }
      iVar16 = iVar16 + 1;
      uVar7 = p->nObjs;
    } while (iVar16 < (int)uVar7);
    if (iVar22 != 0) {
      return iVar22;
    }
  }
  uVar11 = (ulong)uVar7;
  if (p->pPars->fOrderNodes == 0) {
    return 0;
  }
  iVar16 = p->pPars->nVars;
  lVar21 = (long)iVar16;
  iVar22 = 0;
  if ((int)uVar7 <= iVar16 + 1) {
LAB_005b5d1a:
    pVVar10 = p->vPairs;
    if (pVVar10->nSize < 2) {
      return iVar22;
    }
    lVar21 = 0;
    do {
      iVar16 = pVVar10->pArray[lVar21];
      local_34 = iVar16;
      iVar14 = pVVar10->pArray[lVar21 + 1];
      local_38 = iVar14;
      if (iVar14 <= iVar16) {
        __assert_fail("Entry[0] < Entry[1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                      ,0x3b8,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
      }
      iVar4 = p->pPars->nVars;
      piVar20 = &local_3c;
      piVar12 = &local_34;
      bVar2 = true;
      do {
        bVar19 = bVar2;
        *piVar20 = -1;
        iVar5 = p->nObjs;
        if (iVar4 < iVar5) {
          iVar6 = *piVar12;
          do {
            iVar5 = bmcg_sat_solver_read_cex_varvalue
                              (p->pSat,p->TopoBase + iVar6 + (iVar4 - p->pPars->nVars) * iVar5);
            if (iVar5 != 0) {
              *piVar20 = iVar4;
              iVar5 = iVar4;
              goto LAB_005b5ddb;
            }
            iVar4 = iVar4 + 1;
            iVar5 = p->nObjs;
          } while (iVar4 < iVar5);
          iVar5 = -1;
        }
        else {
          iVar5 = -1;
        }
LAB_005b5ddb:
        iVar6 = local_40;
        iVar4 = p->pPars->nVars;
        if (iVar5 < iVar4) {
          __assert_fail("Node[j] >= p->pPars->nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                        ,0x3c2,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
        }
        piVar20 = &local_40;
        piVar12 = &local_38;
        bVar2 = false;
      } while (bVar19);
      if (local_40 < local_3c) {
        iVar4 = bmcg_sat_solver_read_cex_varvalue
                          (p->pSat,p->TopoBase + iVar16 + (local_40 - iVar4) * p->nObjs);
        if (iVar4 != 0) {
          __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[0])) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                        ,0x3ca,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
        }
        iVar4 = bmcg_sat_solver_read_cex_varvalue
                          (p->pSat,p->TopoBase + iVar14 + (iVar6 - p->pPars->nVars) * p->nObjs);
        if (iVar4 != 1) {
          __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[1])) == 1"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                        ,0x3cb,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
        }
        p->nLits[0] = 0;
        pBVar13 = p->pPars;
        iVar4 = pBVar13->nVars;
        iVar5 = 0;
        if (iVar4 <= iVar6) {
          do {
            uVar7 = bmcg_sat_solver_read_cex_varvalue
                              (p->pSat,p->TopoBase + iVar16 + (iVar4 - pBVar13->nVars) * p->nObjs);
            uVar8 = bmcg_sat_solver_read_cex_varvalue
                              (p->pSat,p->TopoBase + iVar14 + (iVar4 - p->pPars->nVars) * p->nObjs);
            if (1 < uVar7) {
LAB_005b5fa4:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            pBVar13 = p->pPars;
            iVar5 = p->TopoBase + iVar16 + (iVar4 - pBVar13->nVars) * p->nObjs;
            if (iVar5 < 0) goto LAB_005b5fa4;
            iVar15 = p->nLits[0];
            p->nLits[0] = iVar15 + 1;
            p->pLits[0][iVar15] = uVar7 + iVar5 * 2;
            if ((1 < uVar8) ||
               (iVar5 = p->TopoBase + iVar14 + (iVar4 - pBVar13->nVars) * p->nObjs, iVar5 < 0))
            goto LAB_005b5fa4;
            iVar15 = p->nLits[0];
            p->nLits[0] = iVar15 + 1;
            p->pLits[0][iVar15] = uVar8 + iVar5 * 2;
            iVar4 = iVar4 + 1;
          } while (iVar6 + 1 != iVar4);
          iVar5 = p->nLits[0];
        }
        iVar16 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],iVar5);
        if (iVar16 == 0) {
          return -1;
        }
        iVar22 = iVar22 + 1;
      }
      lVar21 = lVar21 + 2;
      pVVar10 = p->vPairs;
      if (pVVar10->nSize <= (int)((uint)lVar21 | 1)) {
        return iVar22;
      }
    } while( true );
  }
  lVar23 = lVar21 + 1;
  paiVar17 = p->pFanins + lVar21 + 1;
  piVar20 = p->pFanins[lVar21] + 0x1f;
  iVar22 = 0;
LAB_005b5894:
  pBVar13 = p->pPars;
  uVar7 = pBVar13->nLutSize;
  uVar9 = (ulong)uVar7;
  lVar3 = 0;
  do {
    lVar18 = lVar3;
    iVar16 = (int)lVar21;
    iVar14 = (int)lVar23;
    if ((int)((int)lVar18 + uVar7) < 1) {
      if (uVar9 + lVar18 == 0) {
        if (pBVar13->fMajority != 0) goto LAB_005b5cfc;
        iVar4 = p->LutMask;
        if (-1 < iVar4) goto LAB_005b5ac5;
        if (iVar4 == -1) goto LAB_005b5cfc;
        goto LAB_005b5b2a;
      }
      break;
    }
    lVar3 = lVar18 + -1;
  } while (piVar20[uVar9 + lVar18 + -0x20] == piVar20[uVar9 + lVar18]);
  iVar5 = uVar7 - 1;
  iVar4 = *(int *)((long)(paiVar17 + -1) + lVar18 * 4 + (long)iVar5 * 4);
  if (iVar4 < (*paiVar17)[iVar5 + lVar18]) {
    iVar16 = bmcg_sat_solver_read_cex_varvalue
                       (p->pSat,(*paiVar17)[iVar5 + lVar18] + p->TopoBase +
                                (iVar16 - pBVar13->nVars) * (int)uVar11);
    if (iVar16 != 0) {
      __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i][k])) == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                    ,0x39e,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
    }
    iVar16 = bmcg_sat_solver_read_cex_varvalue
                       (p->pSat,p->TopoBase + (*paiVar17)[iVar5 + lVar18] +
                                (iVar14 - p->pPars->nVars) * p->nObjs);
    if (iVar16 != 1) {
      __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i , p->pFanins[i][k])) == 1"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                    ,0x39f,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
    }
  }
  else {
    iVar4 = bmcg_sat_solver_read_cex_varvalue
                      (p->pSat,iVar4 + p->TopoBase + (iVar16 - pBVar13->nVars) * (int)uVar11);
    if (iVar4 != 1) {
      __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i-1][k])) == 1"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                    ,0x3a3,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
    }
    iVar4 = bmcg_sat_solver_read_cex_varvalue
                      (p->pSat,p->TopoBase +
                               *(int *)((long)(paiVar17 + -1) + lVar18 * 4 + (long)iVar5 * 4) +
                               (iVar14 - p->pPars->nVars) * p->nObjs);
    if (iVar4 != 0) {
      __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i , p->pFanins[i-1][k])) == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                    ,0x3a4,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
    }
    p->nLits[0] = 0;
    iVar4 = *(int *)((long)(paiVar17 + -1) + lVar18 * 4 + (long)iVar5 * 4);
    iVar5 = p->nObjs;
    iVar6 = 0;
    if (iVar4 < iVar5 + -1) {
      pBVar13 = p->pPars;
      do {
        uVar7 = bmcg_sat_solver_read_cex_varvalue
                          (p->pSat,(iVar16 - pBVar13->nVars) * iVar5 + p->TopoBase + iVar4);
        uVar8 = bmcg_sat_solver_read_cex_varvalue
                          (p->pSat,(iVar14 - p->pPars->nVars) * p->nObjs + p->TopoBase + iVar4);
        if (1 < uVar7) goto LAB_005b5fa4;
        pBVar13 = p->pPars;
        iVar5 = (iVar16 - pBVar13->nVars) * p->nObjs + p->TopoBase + iVar4;
        if (iVar5 < 0) goto LAB_005b5fa4;
        iVar6 = p->nLits[0];
        p->nLits[0] = iVar6 + 1;
        p->pLits[0][iVar6] = uVar7 + iVar5 * 2;
        if ((1 < uVar8) ||
           (iVar5 = (iVar14 - pBVar13->nVars) * p->nObjs + p->TopoBase + iVar4, iVar5 < 0))
        goto LAB_005b5fa4;
        iVar6 = p->nLits[0];
        p->nLits[0] = iVar6 + 1;
        p->pLits[0][iVar6] = uVar8 + iVar5 * 2;
        iVar4 = iVar4 + 1;
        iVar5 = p->nObjs;
      } while (iVar4 < iVar5 + -1);
      iVar6 = p->nLits[0];
    }
    iVar16 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],iVar6);
    if (iVar16 == 0) {
      return -1;
    }
    iVar22 = iVar22 + 1;
  }
  goto LAB_005b5cfc;
  while (bVar2 = 0 < iVar4, iVar4 = iVar4 + -1, bVar2) {
LAB_005b5ac5:
    iVar5 = bmcg_sat_solver_read_cex_varvalue
                      (p->pSat,(iVar16 - p->pPars->nVars) * (p->LutMask + 1) + iVar4);
    iVar6 = bmcg_sat_solver_read_cex_varvalue
                      (p->pSat,(iVar14 - p->pPars->nVars) * (p->LutMask + 1) + iVar4);
    if (iVar5 != iVar6) goto LAB_005b5b2a;
  }
  goto LAB_005b5cfc;
LAB_005b5b2a:
  iVar5 = bmcg_sat_solver_read_cex_varvalue
                    (p->pSat,(iVar16 - p->pPars->nVars) * (p->LutMask + 1) + iVar4);
  if ((iVar5 != 0) ||
     (iVar5 = bmcg_sat_solver_read_cex_varvalue
                        (p->pSat,(iVar14 - p->pPars->nVars) * (p->LutMask + 1) + iVar4), iVar5 != 1)
     ) {
    iVar5 = bmcg_sat_solver_read_cex_varvalue
                      (p->pSat,(iVar16 - p->pPars->nVars) * (p->LutMask + 1) + iVar4);
    if (iVar5 != 1) {
      __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                    ,0x38d,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
    }
    iVar5 = bmcg_sat_solver_read_cex_varvalue
                      (p->pSat,(iVar14 - p->pPars->nVars) * (p->LutMask + 1) + iVar4);
    if (iVar5 != 0) {
      __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i , k)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                    ,0x38e,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
    }
    p->nLits[0] = 0;
    iVar5 = p->LutMask;
    iVar6 = 0;
    if (iVar4 <= iVar5) {
      pBVar13 = p->pPars;
      iVar6 = iVar5 * 2;
      do {
        uVar7 = bmcg_sat_solver_read_cex_varvalue
                          (p->pSat,(iVar16 - pBVar13->nVars) * (p->LutMask + 1) + iVar5);
        uVar8 = bmcg_sat_solver_read_cex_varvalue
                          (p->pSat,(iVar14 - p->pPars->nVars) * (p->LutMask + 1) + iVar5);
        if (1 < uVar7) goto LAB_005b5fa4;
        pBVar13 = p->pPars;
        iVar15 = (iVar16 - pBVar13->nVars) * (p->LutMask + 1);
        if (iVar5 + iVar15 < 0) goto LAB_005b5fa4;
        iVar1 = p->nLits[0];
        p->nLits[0] = iVar1 + 1;
        p->pLits[0][iVar1] = uVar7 + iVar15 * 2 + iVar6;
        if ((1 < uVar8) ||
           (iVar15 = (iVar14 - pBVar13->nVars) * (p->LutMask + 1), iVar5 + iVar15 < 0))
        goto LAB_005b5fa4;
        iVar1 = p->nLits[0];
        p->nLits[0] = iVar1 + 1;
        p->pLits[0][iVar1] = uVar8 + iVar15 * 2 + iVar6;
        iVar6 = iVar6 + -2;
        bVar2 = iVar4 < iVar5;
        iVar5 = iVar5 + -1;
      } while (bVar2);
      iVar6 = p->nLits[0];
    }
    iVar16 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],iVar6);
    if (iVar16 == 0) {
      return -1;
    }
    iVar22 = iVar22 + 1;
  }
LAB_005b5cfc:
  lVar23 = lVar23 + 1;
  uVar11 = (ulong)p->nObjs;
  lVar21 = lVar21 + 1;
  paiVar17 = paiVar17 + 1;
  piVar20 = piVar20 + 0x20;
  if ((long)uVar11 <= lVar23) goto LAB_005b5d1a;
  goto LAB_005b5894;
}

Assistant:

int Zyx_ManAddCnfLazyTopo( Zyx_Man_t * p )
{
    int i, k, j, Entry[2], Node[2], nLazy = 0;
    // fanin count
    //printf( "Adding topology clauses.\n" );
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        int nFanins = Zyx_ManCollectFanins( p, i );
        if ( nFanins == p->pPars->nLutSize )
            continue;
        nLazy++;
        assert( nFanins == p->nLits[1] );
        if ( p->nLits[1] > p->pPars->nLutSize )
        {
            p->nLits[1] = p->pPars->nLutSize + 1;
            //Zyx_PrintClause( p->pLits[1], p->nLits[1] );
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[1], p->nLits[1] ) )
                return -1;
        }
        else // if ( p->nLits[1] < p->pPars->nLutSize )
        {
            //Zyx_PrintClause( p->pLits[0], p->nLits[0] );
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                return -1;
        }
    }
    if ( nLazy || !p->pPars->fOrderNodes )
        return nLazy;
    // ordering
    for ( i = p->pPars->nVars + 1; i < p->nObjs; i++ )
    {
        for ( k = p->pPars->nLutSize - 1; k >= 0; k-- )
            if ( p->pFanins[i-1][k] != p->pFanins[i][k] )
                break;
        if ( k == -1 ) // fanins are equal
        {
            if ( p->pPars->fMajority )
                continue;
            // compare by LUT functions
            for ( k = p->LutMask; k >= 0; k-- )
                if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) != 
                     bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i  , k)) )
                    break;
            if ( k == -1 ) // truth tables cannot be equal
                continue;
            // rule out these truth tables
            if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) == 0 && 
                 bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i  , k)) == 1 )
            {
                continue;
            }
            nLazy++;
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) == 1 );
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i  , k)) == 0 );
            // rule out this order
            p->nLits[0] = 0;
            for ( j = p->LutMask; j >= k; j-- )
            {
                int ValA = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, j));
                int ValB = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i,   j));
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_FuncVar(p, i-1, j), ValA );
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_FuncVar(p, i,   j), ValB );
            }
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                return -1;
            continue;
        }
        if ( p->pFanins[i-1][k] < p->pFanins[i][k] )
        {
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i][k])) == 0 );
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i  , p->pFanins[i][k])) == 1 );
            continue;
        }
        nLazy++;
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i-1][k])) == 1 );
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i  , p->pFanins[i-1][k])) == 0 );
        // rule out this order
        p->nLits[0] = 0;
        for ( j = p->pFanins[i-1][k]; j < p->nObjs-1; j++ )
        {
            int ValA = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, j));
            int ValB = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i,   j));
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, i-1, j), ValA );
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, i,   j), ValB );
        }
        //printf( "\n" );
        //Zyx_ManPrintVarMap( p, 1 );
        //Zyx_PrintClause( p->pLits[0], p->nLits[0] );
        if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
            return -1;
        //break;
    }
    // check symmetric variables
    Vec_IntForEachEntryDouble( p->vPairs, Entry[0], Entry[1], k )
    {
        assert( Entry[0] < Entry[1] );
        for ( j = 0; j < 2; j++ )
        {
            Node[j] = -1;
            for ( i = p->pPars->nVars; i < p->nObjs; i++ )
                if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i, Entry[j])) )
                {
                    Node[j] = i;
                    break;
                }
            assert( Node[j] >= p->pPars->nVars );
        }
        // compare the nodes
        if ( Node[0] <= Node[1] )
            continue;
        assert( Node[0] > Node[1] );
        // create blocking clause
        nLazy++;
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[0])) == 0 );
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[1])) == 1 );
        // rule out this order
        p->nLits[0] = 0;
        for ( j = p->pPars->nVars; j <= Node[1]; j++ )
        {
            int ValA = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, j, Entry[0]));
            int ValB = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, j, Entry[1]));
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, j, Entry[0]), ValA );
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, j, Entry[1]), ValB );
        }
        if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
            return -1;
    }
    return nLazy;
}